

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<float>::clear(PropertyT<float> *this)

{
  vector<float,_std::allocator<float>_> local_28;
  PropertyT<float> *local_10;
  PropertyT<float> *this_local;
  
  local_10 = this;
  std::vector<float,_std::allocator<float>_>::clear(&this->data_);
  memset(&local_28,0,0x18);
  std::vector<float,_std::allocator<float>_>::vector(&local_28);
  std::vector<float,_std::allocator<float>_>::swap(&local_28,&this->data_);
  std::vector<float,_std::allocator<float>_>::~vector(&local_28);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }